

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O0

pair<char,_int> *
eastl::
lower_bound<eastl::pair<char,int>const*,char,eastl::detail::compare_impl<eastl::pair<char,int>,eastl::less<char>>>
          (pair<char,_int> *first,pair<char,_int> *last,DifferenceType value)

{
  bool bVar1;
  pair<char,_int> *n;
  DifferenceType d2;
  pair<char,_int> *i;
  DifferenceType d;
  char *value_local;
  pair<char,_int> *last_local;
  pair<char,_int> *first_local;
  
  d = value;
  value_local = &last->first;
  last_local = first;
  n = (pair<char,_int> *)distance<eastl::pair<char,int>const*>(first,last);
  while (i = n, 0 < (long)i) {
    d2 = (DifferenceType)last_local;
    n = (pair<char,_int> *)((long)i >> 1);
    advance<eastl::pair<char,int>const*,long>((pair<char,_int> **)&d2,(long)n);
    bVar1 = detail::compare_impl<eastl::pair<char,_int>,_eastl::less<char>_>::operator()
                      ((compare_impl<eastl::pair<char,_int>,_eastl::less<char>_> *)
                       ((long)&first_local + 7),(pair_type *)d2,(first_argument_type *)d);
    if (bVar1) {
      last_local = (pair<char,_int> *)(d2 + 8);
      n = (pair<char,_int> *)((long)i - (long)&n->field_0x1);
    }
  }
  return last_local;
}

Assistant:

ForwardIterator
    lower_bound(ForwardIterator first, ForwardIterator last, const T& value, Compare compare)
    {
        typedef typename eastl::iterator_traits<ForwardIterator>::difference_type DifferenceType;

        DifferenceType d = eastl::distance(first, last); // This will be efficient for a random access iterator such as an array.

        while(d > 0)
        {
            ForwardIterator i  = first;
            DifferenceType  d2 = d >> 1; // We use '>>1' here instead of '/2' because MSVC++ for some reason generates significantly worse code for '/2'. Go figure.

            eastl::advance(i, d2); // This will be efficient for a random access iterator such as an array.

            if(compare(*i, value))
            {
                // Disabled because std::lower_bound doesn't specify (23.3.3.1, p3) this can be done: EASTL_VALIDATE_COMPARE(!compare(value, *i)); // Validate that the compare function is sane.
                first = ++i;
                d    -= d2 + 1;
            }
            else
                d = d2;
        }
        return first;
    }